

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O2

void __thiscall cppcms::crypto::anon_unknown_3::sha1_digets::readout(sha1_digets *this,void *ptr)

{
  uint uVar1;
  uint i;
  long lVar2;
  uint digets [5];
  uint local_28 [6];
  
  impl::sha1::get_digest(&this->state_,(digest_type)local_28);
  (this->state_).h_[0] = 0x67452301;
  (this->state_).h_[1] = 0xefcdab89;
  (this->state_).h_[2] = 0x98badcfe;
  (this->state_).h_[3] = 0x10325476;
  (this->state_).h_[4] = 0xc3d2e1f0;
  (this->state_).block_byte_index_ = 0;
  (this->state_).byte_count_ = 0;
  for (lVar2 = 0; lVar2 != 5; lVar2 = lVar2 + 1) {
    uVar1 = local_28[lVar2];
    *(uint *)((long)ptr + lVar2 * 4) =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  }
  return;
}

Assistant:

virtual void readout(void *ptr)
			{
				unsigned digets[5];
				state_.get_digest(digets);
				state_.reset();
				unsigned char *out = reinterpret_cast<unsigned char *>(ptr);
				for(unsigned i=0;i<5;i++) {
					unsigned block = digets[i];
					*out ++ = (block >> 24u) & 0xFFu;
					*out ++ = (block >> 16u) & 0xFFu;
					*out ++ = (block >>  8u) & 0xFFu;
					*out ++ = (block >>  0u) & 0xFFu;
				}
			}